

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

bool Minisat::match_signature(char *path,int *sig)

{
  int iVar1;
  FILE *__stream;
  int *in_RSI;
  char *in_RDI;
  bool bVar2;
  int *p;
  bool res;
  FILE *tmp;
  int *local_30;
  bool local_1;
  
  __stream = fopen(in_RDI,"r");
  if (__stream == (FILE *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = true;
    local_30 = in_RSI;
    while( true ) {
      bVar2 = false;
      if (local_1) {
        bVar2 = *local_30 != -1;
      }
      if (!bVar2) break;
      iVar1 = getc(__stream);
      local_1 = iVar1 == *local_30;
      local_30 = local_30 + 1;
    }
    fclose(__stream);
  }
  return local_1;
}

Assistant:

inline bool match_signature(const char *path, const int *sig)
{
    assert(path);
    FILE *tmp = fopen(path, "r");
    if (!tmp) return false;
    bool res = true;
    for (const int *p = sig; res && (*p != EOF); p++) res = (getc(tmp) == *p);
    fclose(tmp);
    return res;
}